

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_combo_separator(nk_context *ctx,char *items_separated_by_separator,int separator,int selected
                      ,int count,int item_height,nk_vec2 size)

{
  nk_bool nVar1;
  int in_ECX;
  int in_EDX;
  char *in_RSI;
  long in_RDI;
  int in_R8D;
  bool bVar2;
  int length;
  char *iter;
  char *current_item;
  nk_vec2 window_padding;
  nk_vec2 item_spacing;
  int max_height;
  int i;
  int in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  uint6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  char *local_58;
  char *local_50;
  int local_34;
  int local_28;
  int local_4;
  
  local_4 = in_ECX;
  if ((in_RDI != 0) && (in_RSI != (char *)0x0)) {
    nk_panel_get_padding
              ((nk_style *)(in_RDI + 0x168),**(nk_panel_type **)(*(long *)(in_RDI + 0x40d8) + 0xa8))
    ;
    local_50 = in_RSI;
    for (local_34 = 0; local_34 < in_R8D; local_34 = local_34 + 1) {
      local_58 = local_50;
      while( true ) {
        bVar2 = false;
        if (*local_58 != '\0') {
          bVar2 = *local_58 != in_EDX;
        }
        if (!bVar2) break;
        local_58 = local_58 + 1;
      }
      in_stack_ffffffffffffff97 = 0;
      if (local_34 == in_ECX) break;
      local_50 = local_58 + 1;
    }
    nVar1 = nk_combo_begin_text((nk_context *)window_padding,current_item,iter._4_4_,stack0x0000003c
                               );
    local_28 = in_ECX;
    if (nVar1 != 0) {
      nk_layout_row_dynamic
                ((nk_context *)
                 CONCAT17(in_stack_ffffffffffffff97,
                          CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
                 in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      local_50 = in_RSI;
      for (local_34 = 0; local_34 < in_R8D; local_34 = local_34 + 1) {
        local_58 = local_50;
        while( true ) {
          bVar2 = false;
          if (*local_58 != '\0') {
            bVar2 = *local_58 != in_EDX;
          }
          if (!bVar2) break;
          local_58 = local_58 + 1;
        }
        nVar1 = nk_combo_item_text((nk_context *)
                                   CONCAT17(in_stack_ffffffffffffff97,
                                            (uint7)in_stack_ffffffffffffff90),
                                   (char *)CONCAT44(in_stack_ffffffffffffff8c,
                                                    in_stack_ffffffffffffff88),0,0x14503c);
        if (nVar1 != 0) {
          local_28 = local_34;
        }
        local_50 = local_50 + (long)((int)local_58 - (int)local_50) + 1;
      }
      nk_combo_end((nk_context *)0x145079);
    }
    local_4 = local_28;
  }
  return local_4;
}

Assistant:

NK_API int
nk_combo_separator(struct nk_context *ctx, const char *items_separated_by_separator,
int separator, int selected, int count, int item_height, struct nk_vec2 size)
{
int i;
int max_height;
struct nk_vec2 item_spacing;
struct nk_vec2 window_padding;
const char *current_item;
const char *iter;
int length = 0;

NK_ASSERT(ctx);
NK_ASSERT(items_separated_by_separator);
if (!ctx || !items_separated_by_separator)
return selected;

/* calculate popup window */
item_spacing = ctx->style.window.spacing;
window_padding = nk_panel_get_padding(&ctx->style, ctx->current->layout->type);
max_height = count * item_height + count * (int)item_spacing.y;
max_height += (int)item_spacing.y * 2 + (int)window_padding.y * 2;
size.y = NK_MIN(size.y, (float)max_height);

/* find selected item */
current_item = items_separated_by_separator;
for (i = 0; i < count; ++i) {
iter = current_item;
while (*iter && *iter != separator) iter++;
length = (int)(iter - current_item);
if (i == selected) break;
current_item = iter + 1;
}

if (nk_combo_begin_text(ctx, current_item, length, size)) {
current_item = items_separated_by_separator;
nk_layout_row_dynamic(ctx, (float)item_height, 1);
for (i = 0; i < count; ++i) {
iter = current_item;
while (*iter && *iter != separator) iter++;
length = (int)(iter - current_item);
if (nk_combo_item_text(ctx, current_item, length, NK_TEXT_LEFT))
selected = i;
current_item = current_item + length + 1;
}
nk_combo_end(ctx);
}
return selected;
}